

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O2

REF_STATUS ref_collapse_to_remove_node1(REF_GRID ref_grid,REF_INT *actual_node0,REF_INT node1)

{
  int *piVar1;
  REF_NODE ref_node;
  REF_INT *pRVar2;
  uint uVar3;
  uint uVar4;
  REF_STATUS RVar5;
  REF_CAVITY_STATE RVar6;
  undefined8 uVar7;
  ulong uVar8;
  REF_GRID original;
  char *pcVar9;
  REF_DBL *pRVar10;
  long lVar11;
  REF_BOOL allowed;
  REF_CAVITY ref_cavity;
  REF_BOOL have_geometry_support;
  REF_INT nnode;
  REF_BOOL allowed_cavity_ratio;
  REF_BOOL local;
  uint *local_3ee8;
  ulong local_3ee0;
  long local_3ed8;
  long local_3ed0;
  REF_DBL min_add;
  REF_DBL min_del;
  REF_INT node_to_collapse [1000];
  REF_INT order [1000];
  REF_DBL ratio_to_collapse [1000];
  
  ref_node = ref_grid->node;
  ref_cavity = (REF_CAVITY)0x0;
  *actual_node0 = -1;
  if (((node1 < 0) || (ref_node->max <= node1)) || (ref_node->global[(uint)node1] < 0)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",0xb4
           ,"ref_collapse_to_remove_node1","node1 is invalid");
    RVar5 = 1;
  }
  else {
    if (ref_grid->surf == 0) {
      lVar11 = 0x28;
      if (ref_grid->twod == 0) {
        lVar11 = 0x50;
      }
    }
    else {
      lVar11 = 0x28;
    }
    uVar3 = ref_cell_node_list_around
                      (*(REF_CELL *)((long)ref_grid->cell + lVar11 + -0x10),node1,1000,&nnode,
                       node_to_collapse);
    if (uVar3 == 0) {
      pRVar10 = ratio_to_collapse;
      lVar11 = 0;
      local_3ee8 = (uint *)actual_node0;
      local_3ee0 = (ulong)(uint)node1;
      do {
        if (nnode <= lVar11) {
          original = (REF_GRID)ratio_to_collapse;
          uVar3 = ref_sort_heap_dbl(nnode,(REF_DBL *)original,order);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar9 = "sort lengths";
            uVar7 = 0xc5;
            goto LAB_0019e7f9;
          }
          local_3ed0 = 0;
          goto LAB_0019e80c;
        }
        uVar3 = ref_node_ratio(ref_node,node_to_collapse[lVar11],node1,pRVar10);
        lVar11 = lVar11 + 1;
        pRVar10 = pRVar10 + 1;
      } while (uVar3 == 0);
      uVar8 = (ulong)uVar3;
      pcVar9 = "ratio";
      uVar7 = 0xc2;
    }
    else {
      uVar8 = (ulong)uVar3;
      pcVar9 = "da hood";
      uVar7 = 0xbe;
    }
LAB_0019e7f9:
    RVar5 = (REF_STATUS)uVar8;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
           uVar7,"ref_collapse_to_remove_node1",uVar8,pcVar9);
  }
  return RVar5;
LAB_0019e80c:
  if (nnode <= local_3ed0) {
    return 0;
  }
  uVar3 = node_to_collapse[order[local_3ed0]];
  ref_collapse_edge_mixed(ref_grid,(REF_INT)original,node1,&allowed);
  if (allowed != 0) {
    original = (REF_GRID)(ulong)uVar3;
    uVar4 = ref_collapse_edge_geometry(ref_grid,uVar3,node1,&allowed);
    if (uVar4 != 0) {
      pcVar9 = "col geom";
      uVar7 = 0xd8;
      goto LAB_0019ed6a;
    }
    if (allowed != 0) {
      original = (REF_GRID)(ulong)uVar3;
      uVar4 = ref_collapse_edge_manifold(ref_grid,uVar3,node1,&allowed);
      if (uVar4 != 0) {
        pcVar9 = "col manifold";
        uVar7 = 0xdd;
        goto LAB_0019ed6a;
      }
      if (allowed != 0) {
        original = (REF_GRID)(ulong)uVar3;
        uVar4 = ref_collapse_edge_chord_height(ref_grid,uVar3,node1,&allowed);
        if (uVar4 != 0) {
          pcVar9 = "col edge chord height";
          uVar7 = 0xe2;
          goto LAB_0019ed6a;
        }
        if (allowed != 0) {
          original = (REF_GRID)(ulong)uVar3;
          uVar4 = ref_collapse_edge_ratio(ref_grid,uVar3,node1,&allowed);
          if (uVar4 != 0) {
            pcVar9 = "ratio";
            uVar7 = 0xe6;
            goto LAB_0019ed6a;
          }
          if (allowed != 0) {
            uVar4 = ref_geom_supported(ref_grid->geom,uVar3,&have_geometry_support);
            if (uVar4 != 0) {
              pcVar9 = "geom";
              uVar7 = 0xec;
              goto LAB_0019ed6a;
            }
            original = (REF_GRID)(ulong)uVar3;
            uVar4 = ref_collapse_edge_normdev(ref_grid,uVar3,node1,&allowed);
            if (uVar4 != 0) {
              pcVar9 = "normdev";
              uVar7 = 0xed;
              goto LAB_0019ed6a;
            }
            if (allowed != 0) {
              original = (REF_GRID)(ulong)uVar3;
              uVar4 = ref_collapse_edge_same_normal(ref_grid,uVar3,node1,&allowed);
              if (uVar4 != 0) {
                pcVar9 = "normal deviation";
                uVar7 = 0xf1;
                goto LAB_0019ed6a;
              }
              if (allowed != 0) {
                original = (REF_GRID)(ulong)uVar3;
                if (have_geometry_support == 0) {
                  uVar4 = ref_collapse_edge_same_tangent(ref_grid,uVar3,node1,&allowed);
                  if (uVar4 != 0) {
                    pcVar9 = "normal deviation";
                    uVar7 = 0xf6;
                    goto LAB_0019ed6a;
                  }
                  if (allowed == 0) goto LAB_0019eb26;
                  if ((have_geometry_support == 0) && (ref_grid->twod != 0)) {
                    uVar4 = ref_collapse_edge_twod_orientation(ref_grid,uVar3,node1,&allowed);
                    if (uVar4 != 0) {
                      pcVar9 = "norm";
                      uVar7 = 0xfc;
                      goto LAB_0019ed6a;
                    }
                    original = (REF_GRID)(ulong)uVar3;
                    if (allowed == 0) goto LAB_0019eb26;
                  }
                }
                original = (REF_GRID)(ulong)uVar3;
                uVar4 = ref_collapse_edge_tri_quality(ref_grid,uVar3,node1,&allowed);
                if (uVar4 != 0) {
                  pcVar9 = "tri qual";
                  uVar7 = 0x102;
                  goto LAB_0019ed6a;
                }
                if (allowed != 0) {
                  uVar4 = ref_collapse_edge_tet_quality(ref_grid,uVar3,node1,&allowed);
                  if (uVar4 != 0) {
                    pcVar9 = "tet qual";
                    uVar7 = 0x107;
                    goto LAB_0019ed6a;
                  }
                  original = (REF_GRID)(ulong)uVar3;
                  lVar11 = (long)(int)uVar3;
                  ref_collapse_edge_local_cell(ref_grid,uVar3,node1,&local);
                  if (local == 0) {
                    if (allowed != 0) {
                      pRVar2 = ref_node->age;
                      piVar1 = pRVar2 + lVar11;
                      *piVar1 = *piVar1 + 1;
                      piVar1 = pRVar2 + local_3ee0;
                      *piVar1 = *piVar1 + 1;
                    }
                  }
                  else {
                    local_3ed8 = lVar11;
                    if (allowed != 0) {
                      *local_3ee8 = uVar3;
                      uVar4 = ref_collapse_edge(ref_grid,uVar3,node1);
                      if (uVar4 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                               ,0x138,"ref_collapse_to_remove_node1",(ulong)uVar4,"col!");
                        return uVar4;
                      }
                      if (ref_grid->adapt->watch_topo == 0) {
                        return 0;
                      }
                      uVar4 = ref_validation_cell_face_node(ref_grid,uVar3);
                      if (uVar4 == 0) {
                        return 0;
                      }
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                             ,0x13b,"ref_collapse_to_remove_node1",(ulong)uVar4,"standard topo");
                      printf("node0 %d node1 %d\n",(ulong)uVar3,(ulong)(uint)node1);
                      return uVar4;
                    }
                    uVar4 = ref_cavity_create(&ref_cavity);
                    if (uVar4 != 0) {
                      pcVar9 = "cav create";
                      uVar7 = 0x114;
                      goto LAB_0019ed6a;
                    }
                    original = ref_grid;
                    RVar5 = ref_cavity_form_edge_collapse(ref_cavity,ref_grid,uVar3,node1);
                    if ((RVar5 == 0) && (ref_cavity->state != REF_CAVITY_INCONSISTENT)) {
                      uVar4 = ref_cavity_enlarge_visible(ref_cavity);
                      if (uVar4 != 0) {
                        pcVar9 = "enlarge";
                        uVar7 = 0x118;
                        goto LAB_0019ed6a;
                      }
                      RVar6 = ref_cavity->state;
                      if (RVar6 == REF_CAVITY_VISIBLE) {
                        uVar4 = ref_cavity_ratio(ref_cavity,&allowed_cavity_ratio);
                        if (uVar4 != 0) {
                          pcVar9 = "cavity ratio";
                          uVar7 = 0x11b;
                          goto LAB_0019ed6a;
                        }
                        original = (REF_GRID)&min_del;
                        uVar4 = ref_cavity_change(ref_cavity,(REF_DBL *)original,&min_add);
                        if (uVar4 != 0) {
                          pcVar9 = "cavity change";
                          uVar7 = 0x11d;
                          goto LAB_0019ed6a;
                        }
                        if ((allowed_cavity_ratio != 0) &&
                           (pRVar10 = &ref_grid->adapt->collapse_quality_absolute,
                           *pRVar10 <= min_add && min_add != *pRVar10)) {
                          *local_3ee8 = uVar3;
                          uVar4 = ref_cavity_replace(ref_cavity);
                          if (uVar4 == 0) {
                            uVar4 = ref_cavity_free(ref_cavity);
                            if (uVar4 == 0) {
                              ref_cavity = (REF_CAVITY)0x0;
                              if (ref_grid->adapt->watch_topo == 0) {
                                return 0;
                              }
                              uVar4 = ref_validation_cell_face_node(ref_grid,uVar3);
                              if (uVar4 == 0) {
                                return 0;
                              }
                              pcVar9 = "cavity topo";
                              uVar7 = 0x128;
                            }
                            else {
                              pcVar9 = "cav free";
                              uVar7 = 0x124;
                            }
                          }
                          else {
                            pcVar9 = "cav replace";
                            uVar7 = 0x123;
                          }
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                                 ,uVar7,"ref_collapse_to_remove_node1",(ulong)uVar4,pcVar9);
                          return uVar4;
                        }
                        RVar6 = ref_cavity->state;
                      }
                      if (RVar6 == REF_CAVITY_PARTITION_CONSTRAINED) {
                        pRVar2 = ref_node->age;
                        piVar1 = pRVar2 + local_3ed8;
                        *piVar1 = *piVar1 + 1;
                        piVar1 = pRVar2 + local_3ee0;
                        *piVar1 = *piVar1 + 1;
                      }
                    }
                    uVar4 = ref_cavity_free(ref_cavity);
                    if (uVar4 != 0) {
                      pcVar9 = "cav free";
                      uVar7 = 0x131;
LAB_0019ed6a:
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                             ,uVar7,"ref_collapse_to_remove_node1",(ulong)uVar4,pcVar9);
                      return uVar4;
                    }
                    ref_cavity = (REF_CAVITY)0x0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0019eb26:
  local_3ed0 = local_3ed0 + 1;
  goto LAB_0019e80c;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_to_remove_node1(REF_GRID ref_grid,
                                                REF_INT *actual_node0,
                                                REF_INT node1) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT nnode, node;
  REF_INT node_to_collapse[MAX_NODE_LIST];
  REF_INT order[MAX_NODE_LIST];
  REF_DBL ratio_to_collapse[MAX_NODE_LIST];
  REF_INT node0;
  REF_BOOL allowed, local, have_geometry_support;
  REF_CAVITY ref_cavity = (REF_CAVITY)NULL;
  REF_BOOL valid_cavity;
  REF_BOOL allowed_cavity_ratio;
  REF_DBL min_del, min_add;
  REF_BOOL audit = REF_FALSE;

  *actual_node0 = REF_EMPTY;
  RAS(ref_node_valid(ref_node, node1), "node1 is invalid");

  if (ref_grid_surf(ref_grid) || ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  RSS(ref_cell_node_list_around(ref_cell, node1, MAX_NODE_LIST, &nnode,
                                node_to_collapse),
      "da hood");
  for (node = 0; node < nnode; node++) {
    RSS(ref_node_ratio(ref_node, node_to_collapse[node], node1,
                       &(ratio_to_collapse[node])),
        "ratio");
  }

  RSS(ref_sort_heap_dbl(nnode, ratio_to_collapse, order), "sort lengths");

  /* audit = (nnode > 0 && ratio_to_collapse[order[0]] < 0.2); */
  if (audit) {
    printf("node1 %d %f %f %f\n", node1, ref_node_xyz(ref_node, 0, node1),
           ref_node_xyz(ref_node, 1, node1), ref_node_xyz(ref_node, 2, node1));
  }

  for (node = 0; node < nnode; node++) {
    node0 = node_to_collapse[order[node]];
    if (audit)
      printf(" %d node0 %d ratio %f\n", nnode - node, node0,
             ratio_to_collapse[order[node]]);

    RSS(ref_collapse_edge_mixed(ref_grid, node0, node1, &allowed), "col mixed");
    if (!allowed && audit) printf("   mixed\n");
    if (!allowed) continue;

    RSS(ref_collapse_edge_geometry(ref_grid, node0, node1, &allowed),
        "col geom");
    if (!allowed && audit) printf("   geom\n");
    if (!allowed) continue;

    RSS(ref_collapse_edge_manifold(ref_grid, node0, node1, &allowed),
        "col manifold");
    if (!allowed && audit) printf("   manifold\n");
    if (!allowed) continue;

    RSS(ref_collapse_edge_chord_height(ref_grid, node0, node1, &allowed),
        "col edge chord height");
    if (!allowed && audit) printf("   chord\n");
    if (!allowed) continue;

    RSS(ref_collapse_edge_ratio(ref_grid, node0, node1, &allowed), "ratio");
    if (!allowed && audit) printf("   ratio\n");
    if (!allowed) continue;

    RSS(ref_geom_supported(ref_grid_geom(ref_grid), node0,
                           &have_geometry_support),
        "geom");
    RSS(ref_collapse_edge_normdev(ref_grid, node0, node1, &allowed), "normdev");
    if (!allowed && audit) printf("   normdev\n");
    if (!allowed) continue;
    RSS(ref_collapse_edge_same_normal(ref_grid, node0, node1, &allowed),
        "normal deviation");
    if (!allowed && audit) printf("   same normal\n");
    if (!allowed) continue;
    if (!have_geometry_support) {
      RSS(ref_collapse_edge_same_tangent(ref_grid, node0, node1, &allowed),
          "normal deviation");
      if (!allowed && audit) printf("   same tangent\n");
      if (!allowed) continue;
    }
    if (!have_geometry_support && ref_grid_twod(ref_grid)) {
      RSS(ref_collapse_edge_twod_orientation(ref_grid, node0, node1, &allowed),
          "norm");
      if (!allowed && audit) printf("   twod orientation\n");
      if (!allowed) continue;
    }

    RSS(ref_collapse_edge_tri_quality(ref_grid, node0, node1, &allowed),
        "tri qual");
    if (!allowed && audit) printf("   tri qual\n");
    if (!allowed) continue;

    RSS(ref_collapse_edge_tet_quality(ref_grid, node0, node1, &allowed),
        "tet qual");
    if (!allowed && audit) printf("   tet qual\n");

    RSS(ref_collapse_edge_local_cell(ref_grid, node0, node1, &local), "colloc");
    if (!local) {
      if (allowed) {
        ref_node_age(ref_node, node0)++;
        ref_node_age(ref_node, node1)++;
      }
      continue;
    }

    if (!allowed) {
      RSS(ref_cavity_create(&ref_cavity), "cav create");
      if ((REF_SUCCESS ==
           ref_cavity_form_edge_collapse(ref_cavity, ref_grid, node0, node1)) &&
          (REF_CAVITY_INCONSISTENT != ref_cavity_state(ref_cavity))) {
        RSS(ref_cavity_enlarge_visible(ref_cavity), "enlarge");
        if (REF_CAVITY_VISIBLE == ref_cavity_state(ref_cavity)) {
          RSS(ref_cavity_ratio(ref_cavity, &allowed_cavity_ratio),
              "cavity ratio");
          RSS(ref_cavity_change(ref_cavity, &min_del, &min_add),
              "cavity change");
          valid_cavity =
              allowed_cavity_ratio &&
              (min_add > ref_grid_adapt(ref_grid, collapse_quality_absolute));
          if (valid_cavity) {
            *actual_node0 = node0;
            RSS(ref_cavity_replace(ref_cavity), "cav replace");
            RSS(ref_cavity_free(ref_cavity), "cav free");
            ref_cavity = (REF_CAVITY)NULL;
            if (ref_grid_adapt(ref_grid, watch_topo))
              RSS(ref_validation_cell_face_node(ref_grid, node0),
                  "cavity topo");
            return REF_SUCCESS;
          }
        }
        if (REF_CAVITY_PARTITION_CONSTRAINED == ref_cavity_state(ref_cavity)) {
          ref_node_age(ref_node, node0)++;
          ref_node_age(ref_node, node1)++;
        }
      }
      RSS(ref_cavity_free(ref_cavity), "cav free");
      ref_cavity = (REF_CAVITY)NULL;
      if (!allowed && audit) printf("   cav unsuccessful\n");
      continue;
    }

    *actual_node0 = node0;
    RSS(ref_collapse_edge(ref_grid, node0, node1), "col!");
    if (ref_grid_adapt(ref_grid, watch_topo))
      RSB(ref_validation_cell_face_node(ref_grid, node0), "standard topo",
          { printf("node0 %d node1 %d\n", node0, node1); });
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}